

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O0

void ResetDeleteHook(void)

{
  bool bVar1;
  
  g_DeleteHook_calls = 0;
  bVar1 = MallocHook::RemoveDeleteHook(IncrementCallsToDeleteHook);
  if (!bVar1) {
    syscall(1,2,
            "Check failed: MallocHook::RemoveDeleteHook( (MallocHook::DeleteHook)&IncrementCallsToDeleteHook)\n"
            ,0x61);
    abort();
  }
  return;
}

Assistant:

static void TestAlignmentForSize(int size) {
  const size_t min_align = TestingPortal::Get()->GetMinAlign();

  printf("Testing alignment of malloc(%d)\n", size);
  static const int kNum = 100;
  void* ptrs[kNum];
  for (int i = 0; i < kNum; i++) {
    ptrs[i] = malloc(size);
    uintptr_t p = reinterpret_cast<uintptr_t>(ptrs[i]);
    CHECK((p % sizeof(void*)) == 0);
    CHECK((p % sizeof(double)) == 0);

    // Must have 16-byte (or 8-byte in case of -DTCMALLOC_ALIGN_8BYTES)
    // alignment for large enough objects
    if (size >= min_align) {
      CHECK((p % min_align) == 0);
    }
  }
  for (int i = 0; i < kNum; i++) {
    free(ptrs[i]);
  }
}